

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O0

int dumbfile_seek(DUMBFILE *f,long n,int origin)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  long local_10;
  
  if (in_EDX == 1) {
    local_10 = in_RDI[2] + in_RSI;
  }
  else {
    local_10 = in_RSI;
    if (in_EDX == 2) {
      local_10 = (**(code **)(*in_RDI + 0x30))(in_RDI[1]);
      local_10 = local_10 + in_RSI;
    }
  }
  in_RDI[2] = local_10;
  iVar1 = (**(code **)(*in_RDI + 0x28))(in_RDI[1],local_10);
  return iVar1;
}

Assistant:

int DUMBEXPORT dumbfile_seek(DUMBFILE *f, long n, int origin)
{
    switch ( origin )
    {
    case DFS_SEEK_CUR: n += f->pos; break;
    case DFS_SEEK_END: n += (*f->dfs->get_size)(f->file); break;
    }
    f->pos = n;
    return (*f->dfs->seek)(f->file, n);
}